

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  int *piVar1;
  Enum EVar2;
  char *pcVar3;
  undefined8 *puVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  anon_union_24_2_13149d16_for_String_2 *__s2;
  String *pSVar9;
  IReporter **curr_rep;
  long lVar10;
  undefined8 *puVar11;
  ulong uVar12;
  long *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  anon_union_24_2_13149d16_for_String_2 local_80;
  String local_68;
  String local_50;
  String local_38;
  
  EVar2 = (this->super_AssertData).m_at;
  if ((EVar2 & is_throws) == 0) {
    if ((~EVar2 & 0x60) == 0) {
      if ((this->super_AssertData).m_threw_as == false) {
        (this->super_AssertData).m_failed = true;
        goto LAB_0010a367;
      }
LAB_0010a31f:
      String::String((String *)&local_80.data,(this->super_AssertData).m_exception_string);
      __s2 = &local_80;
      if (local_80.buf[0x17] < '\0') {
        __s2 = (anon_union_24_2_13149d16_for_String_2 *)CONCAT71(local_80._1_7_,local_80.buf[0]);
      }
      if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
        pSVar9 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
      }
      else {
        pSVar9 = &(this->super_AssertData).m_exception;
      }
      iVar7 = strcmp((char *)pSVar9,__s2->buf);
      (this->super_AssertData).m_failed = iVar7 != 0;
      String::~String((String *)&local_80.data);
      __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      goto LAB_0010a367;
    }
    if ((EVar2 & is_throws_as) != 0) {
      bVar5 = (this->super_AssertData).m_threw_as;
      goto LAB_0010a307;
    }
    if ((EVar2 & is_throws_with) != 0) goto LAB_0010a31f;
    if (-1 < (char)EVar2) goto LAB_0010a367;
    bVar5 = (this->super_AssertData).m_threw;
  }
  else {
    bVar5 = (this->super_AssertData).m_threw;
LAB_0010a307:
    bVar5 = bVar5 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar5;
LAB_0010a367:
  bVar5 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar5 < '\0') {
    uVar8 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    uVar8 = 0x17 - (bVar5 & 0x1f);
  }
  if (uVar8 != 0) {
    pSVar9 = &(this->super_AssertData).m_exception;
    String::String(&local_38,"\"");
    operator+(&local_50,&local_38,pSVar9);
    String::String(&local_68,"\"");
    operator+((String *)&local_80.data,&local_50,&local_68);
    if (&pSVar9->field_0 != &local_80) {
      if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
         (pcVar3 = (pSVar9->field_0).data.ptr, pcVar3 != (char *)0x0)) {
        operator_delete__(pcVar3);
      }
      *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
           CONCAT17(local_80.buf[0x17],local_80._16_7_);
      (pSVar9->field_0).data.ptr = (char *)CONCAT71(local_80._1_7_,local_80.buf[0]);
      *(undefined8 *)((long)&(this->super_AssertData).m_exception.field_0 + 8) = local_80._8_8_;
      local_80.buf[0] = '\0';
      local_80.buf[0x17] = '\x17';
    }
    String::~String((String *)&local_80.data);
    String::~String(&local_68);
    String::~String(&local_50);
    String::~String(&local_38);
    __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  }
  if (is_running_in_test == '\x01') {
    if (((this->super_AssertData).m_at & is_warn) == 0) {
      lVar10 = g_cs + 0xb8;
      if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
        LOCK();
        UNLOCK();
        uVar12 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
        MultiLaneAtomic<int>::myAtomic()::laneCounter =
             MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
        *(ulong *)(*in_FS_OFFSET + -0x10) = uVar12;
        *(undefined1 *)(*in_FS_OFFSET + -8) = 1;
      }
      else {
        uVar12 = *(ulong *)(*in_FS_OFFSET + -0x10);
      }
      LOCK();
      piVar1 = (int *)(lVar10 + uVar12 * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar4 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar11 = *(undefined8 **)(g_cs + 0x10d0); puVar11 != puVar4; puVar11 = puVar11 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar11 + 0x48))((long *)*puVar11,this);
    }
    if (((this->super_AssertData).m_failed != false) &&
       (((this->super_AssertData).m_at & is_warn) == 0)) {
      lVar10 = g_cs + 0x8b8;
      if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
        LOCK();
        UNLOCK();
        uVar12 = (ulong)((uint)MultiLaneAtomic<int>::myAtomic()::laneCounter & 0x1f);
        MultiLaneAtomic<int>::myAtomic()::laneCounter =
             MultiLaneAtomic<int>::myAtomic()::laneCounter + 1;
        *(ulong *)(*in_FS_OFFSET + -0x10) = uVar12;
        *(undefined1 *)(*in_FS_OFFSET + -8) = 1;
      }
      else {
        uVar12 = *(ulong *)(*in_FS_OFFSET + -0x10);
      }
      LOCK();
      piVar1 = (int *)(lVar10 + uVar12 * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    __x = (double)(**(code **)(g_cs + 0x10e8))(this);
  }
  if ((this->super_AssertData).m_failed == true) {
    bVar6 = isDebuggerActive();
    __x = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    if (bVar6) {
      __x = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    }
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }